

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3Fts3HashInsert(Fts3Hash *pH,void *pKey,int nKey,void *data)

{
  uint new_size;
  int iVar1;
  Fts3HashElem *pFVar2;
  Fts3HashElem *pFVar3;
  void *pvVar4;
  Fts3Hash *in_RCX;
  int in_EDX;
  void *in_RSI;
  Fts3Hash *in_RDI;
  void *old_data;
  _func_int_void_ptr_int *xHash;
  Fts3HashElem *new_elem;
  Fts3HashElem *elem;
  int h;
  int hraw;
  sqlite3_int64 in_stack_ffffffffffffffb0;
  Fts3Hash *pH_00;
  undefined1 *puVar5;
  Fts3Hash *local_8;
  
  puVar5 = &DAT_aaaaaaaaaaaaaaaa;
  pH_00 = (Fts3Hash *)&DAT_aaaaaaaaaaaaaaaa;
  pFVar2 = (Fts3HashElem *)ftsHashFunction((int)in_RDI->keyClass);
  new_size = (*(code *)pFVar2)(in_RSI,in_EDX);
  pFVar3 = fts3FindElementByHash
                     (in_RCX,(void *)CONCAT44(new_size,new_size & in_RDI->htsize - 1U),
                      (int)((ulong)puVar5 >> 0x20),(int)puVar5);
  if (pFVar3 == (Fts3HashElem *)0x0) {
    if (in_RCX == (Fts3Hash *)0x0) {
      local_8 = (Fts3Hash *)0x0;
    }
    else if (((in_RDI->htsize == 0) && (iVar1 = fts3Rehash(in_RCX,new_size), iVar1 != 0)) ||
            ((in_RDI->htsize <= in_RDI->count && (iVar1 = fts3Rehash(in_RCX,new_size), iVar1 != 0)))
            ) {
      in_RDI->count = 0;
      local_8 = in_RCX;
    }
    else {
      pFVar2 = (Fts3HashElem *)fts3HashMalloc(in_stack_ffffffffffffffb0);
      local_8 = in_RCX;
      if (pFVar2 != (Fts3HashElem *)0x0) {
        if ((in_RDI->copyKey == '\0') || (in_RSI == (void *)0x0)) {
          pFVar2->pKey = in_RSI;
        }
        else {
          pvVar4 = fts3HashMalloc(in_stack_ffffffffffffffb0);
          pFVar2->pKey = pvVar4;
          if (pFVar2->pKey == (void *)0x0) {
            fts3HashFree((void *)0x23d03e);
            return in_RCX;
          }
          memcpy(pFVar2->pKey,in_RSI,(long)in_EDX);
        }
        pFVar2->nKey = in_EDX;
        in_RDI->count = in_RDI->count + 1;
        fts3HashInsertElement(in_RDI,in_RDI->ht + (int)(new_size & in_RDI->htsize - 1U),pFVar2);
        pFVar2->data = in_RCX;
        local_8 = (Fts3Hash *)0x0;
      }
    }
  }
  else {
    local_8 = (Fts3Hash *)pFVar3->data;
    if (in_RCX == (Fts3Hash *)0x0) {
      fts3RemoveElementByHash(pH_00,pFVar2,(int)((ulong)local_8 >> 0x20));
    }
    else {
      pFVar3->data = in_RCX;
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Fts3HashInsert(
  Fts3Hash *pH,        /* The hash table to insert into */
  const void *pKey,    /* The key */
  int nKey,            /* Number of bytes in the key */
  void *data           /* The data */
){
  int hraw;                 /* Raw hash value of the key */
  int h;                    /* the hash of the key modulo hash table size */
  Fts3HashElem *elem;       /* Used to loop thru the element list */
  Fts3HashElem *new_elem;   /* New element added to the pH */
  int (*xHash)(const void*,int);  /* The hash function */

  assert( pH!=0 );
  xHash = ftsHashFunction(pH->keyClass);
  assert( xHash!=0 );
  hraw = (*xHash)(pKey, nKey);
  assert( (pH->htsize & (pH->htsize-1))==0 );
  h = hraw & (pH->htsize-1);
  elem = fts3FindElementByHash(pH,pKey,nKey,h);
  if( elem ){
    void *old_data = elem->data;
    if( data==0 ){
      fts3RemoveElementByHash(pH,elem,h);
    }else{
      elem->data = data;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  if( (pH->htsize==0 && fts3Rehash(pH,8))
   || (pH->count>=pH->htsize && fts3Rehash(pH, pH->htsize*2))
  ){
    pH->count = 0;
    return data;
  }
  assert( pH->htsize>0 );
  new_elem = (Fts3HashElem*)fts3HashMalloc( sizeof(Fts3HashElem) );
  if( new_elem==0 ) return data;
  if( pH->copyKey && pKey!=0 ){
    new_elem->pKey = fts3HashMalloc( nKey );
    if( new_elem->pKey==0 ){
      fts3HashFree(new_elem);
      return data;
    }
    memcpy((void*)new_elem->pKey, pKey, nKey);
  }else{
    new_elem->pKey = (void*)pKey;
  }
  new_elem->nKey = nKey;
  pH->count++;
  assert( pH->htsize>0 );
  assert( (pH->htsize & (pH->htsize-1))==0 );
  h = hraw & (pH->htsize-1);
  fts3HashInsertElement(pH, &pH->ht[h], new_elem);
  new_elem->data = data;
  return 0;
}